

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

int __thiscall booster::locale::gnu_gettext::mo_file::init(mo_file *this,EVP_PKEY_CTX *ctx)

{
  uint32_t uVar1;
  
  uVar1 = get(this,8);
  this->size_ = (ulong)uVar1;
  uVar1 = get(this,0xc);
  this->keys_offset_ = uVar1;
  uVar1 = get(this,0x10);
  this->translations_offset_ = uVar1;
  uVar1 = get(this,0x14);
  this->hash_size_ = uVar1;
  uVar1 = get(this,0x18);
  this->hash_offset_ = uVar1;
  return uVar1;
}

Assistant:

void init()
                {
                    // Read all format sizes
                    size_=get(8);
                    keys_offset_=get(12);
                    translations_offset_=get(16);
                    hash_size_=get(20);
                    hash_offset_=get(24);
                }